

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# corruption_test.cc
# Opt level: O1

void __thiscall
leveldb::CorruptionTest_TableFile_Test::TestBody(CorruptionTest_TableFile_Test *this)

{
  DBImpl *this_00;
  _func_int **in_RAX;
  DB local_28;
  
  local_28._vptr_DB = in_RAX;
  CorruptionTest::Build(&this->super_CorruptionTest,100);
  this_00 = (DBImpl *)(this->super_CorruptionTest).db_;
  DBImpl::TEST_CompactMemTable((DBImpl *)&stack0xffffffffffffffd8);
  if (local_28._vptr_DB != (_func_int **)0x0) {
    operator_delete__(local_28._vptr_DB);
  }
  DBImpl::TEST_CompactRange(this_00,0,(Slice *)0x0,(Slice *)0x0);
  DBImpl::TEST_CompactRange(this_00,1,(Slice *)0x0,(Slice *)0x0);
  CorruptionTest::Corrupt(&this->super_CorruptionTest,kTableFile,100,1);
  CorruptionTest::Check(&this->super_CorruptionTest,0x5a,99);
  return;
}

Assistant:

TEST_F(CorruptionTest, TableFile) {
  Build(100);
  DBImpl* dbi = reinterpret_cast<DBImpl*>(db_);
  dbi->TEST_CompactMemTable();
  dbi->TEST_CompactRange(0, nullptr, nullptr);
  dbi->TEST_CompactRange(1, nullptr, nullptr);

  Corrupt(kTableFile, 100, 1);
  Check(90, 99);
}